

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<capnp::word> *
kj::_::CopyConstructArray_<kj::Array<capnp::word>,_kj::Array<capnp::word>_*,_true,_false>::apply
          (Array<capnp::word> *pos,Array<capnp::word> *start,Array<capnp::word> *end)

{
  Array<capnp::word> *params;
  Array<capnp::word> *end_local;
  Array<capnp::word> *start_local;
  Array<capnp::word> *pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<kj::Array<capnp::word>>(end_local);
    ctor<kj::Array<capnp::word>,kj::Array<capnp::word>>(start_local,params);
    end_local = end_local + 1;
    start_local = start_local + 1;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }